

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O0

bool __thiscall
ON_TextureMapping::TileTextureCoordinate(ON_TextureMapping *this,int dir,double count,double offset)

{
  bool bVar1;
  ON_Xform local_130;
  undefined1 local_b0 [8];
  ON_Xform x;
  bool rc;
  double offset_local;
  double count_local;
  int dir_local;
  ON_TextureMapping *this_local;
  
  x.m_xform[3][3]._7_1_ = 0;
  if ((((-1 < dir) && (dir < 4)) && ((count != 0.0 || (NAN(count))))) &&
     ((bVar1 = ON_IsValid(count), bVar1 && (bVar1 = ON_IsValid(offset), bVar1)))) {
    memcpy(local_b0,&ON_Xform::IdentityTransformation,0x80);
    x.m_xform[(long)dir + -1][(long)dir + 3] = count;
    x.m_xform[dir][2] = offset;
    ON_Xform::operator*(&local_130,(ON_Xform *)local_b0,&this->m_uvw);
    memcpy(&this->m_uvw,&local_130,0x80);
    x.m_xform[3][3]._7_1_ = 1;
  }
  return (bool)(x.m_xform[3][3]._7_1_ & 1);
}

Assistant:

bool ON_TextureMapping::TileTextureCoordinate( int dir, double count, double offset )
{
  bool rc = false;
  if ( 0 <= dir && dir <= 3 && 0.0 != count && ON_IsValid(count) && ON_IsValid(offset) )
  {
    ON_Xform x(ON_Xform::IdentityTransformation);
    x.m_xform[dir][dir] = count;
    x.m_xform[dir][3] = offset;
    m_uvw = x*m_uvw;
    rc = true;
  }
  return rc;
}